

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O1

void Bal_ManFree(Bal_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  Vec_Int_t *__ptr_00;
  long lVar1;
  
  __ptr = p->vCutSets;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (0 < __ptr->nSize) {
      lVar1 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar1]) {
          free(__ptr->pArray[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
  }
  __ptr_00 = p->vCosts;
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
  }
  if (p != (Bal_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Bal_ManFree( Bal_Man_t * p )
{
    Vec_PtrFreeFree( p->vCutSets );
    Vec_IntFree( p->vCosts );
    ABC_FREE( p );
}